

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

void xmlC14NErrFull(xmlC14NCtxPtr ctxt,xmlNodePtr node,int code,char *str1,char *msg,...)

{
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [40];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_5c;
  undefined1 local_58 [4];
  int res;
  va_list ap;
  char *msg_local;
  char *str1_local;
  int code_local;
  xmlNodePtr node_local;
  xmlC14NCtxPtr ctxt_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if (ctxt != (xmlC14NCtxPtr)0x0) {
    ctxt->error = code;
  }
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  res = 0x30;
  local_58 = (undefined1  [4])0x28;
  local_f0 = in_R9;
  local_5c = xmlVRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,
                            node,0x15,code,XML_ERR_ERROR,(char *)0x0,0,str1,(char *)0x0,(char *)0x0,
                            0,0,msg,(__va_list_tag *)local_58);
  if (local_5c < 0) {
    xmlC14NErrMemory(ctxt);
  }
  return;
}

Assistant:

static void
xmlC14NErrFull(xmlC14NCtxPtr ctxt, xmlNodePtr node, int code, const char *str1,
               const char *msg, ...)
{
    va_list ap;
    int res;

    if (ctxt != NULL)
        ctxt->error = code;

    va_start(ap, msg);
    res = xmlVRaiseError(NULL, NULL, NULL, ctxt, node,
                         XML_FROM_C14N, code, XML_ERR_ERROR, NULL, 0,
                         str1, NULL, NULL, 0, 0,
                         msg, ap);
    va_end(ap);
    if (res < 0)
        xmlC14NErrMemory(ctxt);
}